

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O3

void __thiscall Amiga::Chipset::output<52>(Chipset *this)

{
  int iVar1;
  unsigned_long *puVar2;
  byte bVar3;
  int iVar4;
  uint64_t uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  TwoSpriteShifter *this_00;
  uint16_t *puVar10;
  
  Audio::output(&this->audio_);
  this_00 = (this->sprite_shifters_)._M_elems;
  puVar10 = &(this->sprites_)._M_elems[1].h_start;
  uVar9 = 0xfffffffffffffffe;
  do {
    if ((*(char *)((long)puVar10 + -0x31) == '\x01') && ((puVar10[-0x18] & 0xfffe) == 0x68)) {
      TwoSpriteShifter::load<0>(this_00,puVar10[-0x1a],puVar10[-0x1b],puVar10[-0x18] & 1);
    }
    if ((*(bool *)((long)puVar10 + -1) == true) && ((*puVar10 & 0xfffe) == 0x68)) {
      TwoSpriteShifter::load<1>(this_00,puVar10[-2],puVar10[-3],*puVar10 & 1);
    }
    uVar9 = uVar9 + 2;
    this_00 = this_00 + 1;
    puVar10 = puVar10 + 0x30;
  } while (uVar9 < 6);
  iVar8 = this->y_;
  if (this->vertical_blank_height_ <= iVar8) {
    this->display_horizontal_ =
         ((this->display_window_start_[0] & 0xfffe) == 0x68 || this->display_horizontal_ != false)
         && (this->display_window_stop_[0] & 0xfffe) != 0x68;
    goto LAB_0021eb73;
  }
  iVar7 = this->vertical_blank_height_ >> 1;
  iVar1 = iVar7 + -1;
  if (this->is_long_field_ == true) {
    if ((iVar8 < iVar1) || (iVar7 + 2 < iVar8)) {
      iVar4 = this->line_length_;
      goto joined_r0x0021eb48;
    }
    if (iVar8 == iVar1) {
      if (this->line_length_ != 0x35) goto LAB_0021eb73;
      iVar8 = -0xf4;
      goto LAB_0021eb6e;
    }
    iVar4 = this->line_length_;
    if (iVar8 != iVar7 + 2) goto joined_r0x0021eb60;
    if (iVar4 != 0x35) goto LAB_0021eb73;
    iVar8 = -0xf4;
  }
  else {
    iVar4 = this->line_length_;
    if (iVar8 <= iVar7 + 1 && iVar1 <= iVar8) {
joined_r0x0021eb60:
      if (iVar4 != 0x35) goto LAB_0021eb73;
      iVar8 = 0x44;
LAB_0021eb6e:
      Outputs::CRT::CRT::output_sync(&this->crt_,iVar8);
      goto LAB_0021eb73;
    }
joined_r0x0021eb48:
    if (iVar4 != 0x35) goto LAB_0021eb73;
    iVar8 = 0x44;
  }
  Outputs::CRT::CRT::output_blank(&this->crt_,iVar8);
LAB_0021eb73:
  bVar3 = (&DAT_004a9720)[(ulong)this->is_high_res_ * 4];
  uVar9 = (this->bitplane_pixels_).data_._M_elems[0];
  puVar2 = (this->bitplane_pixels_).data_._M_elems + 1;
  bVar6 = bVar3 & 0x3f;
  *puVar2 = *puVar2 << bVar6 | uVar9 >> 0x40 - bVar6;
  (this->bitplane_pixels_).data_._M_elems[0] = uVar9 << (bVar3 & 0x3f);
  uVar5 = (this->sprite_shifters_)._M_elems[1].data_;
  (this->sprite_shifters_)._M_elems[0].data_ =
       (ulong)(this->sprite_shifters_)._M_elems[0].overflow_ |
       (this->sprite_shifters_)._M_elems[0].data_ << 8;
  (this->sprite_shifters_)._M_elems[0].overflow_ = '\0';
  (this->sprite_shifters_)._M_elems[1].data_ =
       (ulong)(this->sprite_shifters_)._M_elems[1].overflow_ | uVar5 << 8;
  (this->sprite_shifters_)._M_elems[1].overflow_ = '\0';
  (this->sprite_shifters_)._M_elems[2].data_ =
       (ulong)(this->sprite_shifters_)._M_elems[2].overflow_ |
       (this->sprite_shifters_)._M_elems[2].data_ << 8;
  (this->sprite_shifters_)._M_elems[2].overflow_ = '\0';
  (this->sprite_shifters_)._M_elems[3].data_ =
       (ulong)(this->sprite_shifters_)._M_elems[3].overflow_ |
       (this->sprite_shifters_)._M_elems[3].data_ << 8;
  (this->sprite_shifters_)._M_elems[3].overflow_ = '\0';
  return;
}

Assistant:

void Chipset::output() {
	// Notes to self on guesses below:
	//
	// Hardware stop is at 0x18;
	// 12/64 * 227 = 42.5625
	//
	// "However, horizontal blanking actually limits the displayable
	// video to 368 low resolution pixel"
	//
	// => 184 windows out of 227 are visible, which concurs.

	// TODO: Reload bitplanes if anything is pending.
//	if(has_next_bitplanes_) {
//		has_next_bitplanes_ = false;
//		bitplane_pixels_.set(
//			previous_bitplanes_,
//			next_bitplanes_,
//			odd_delay_,
//			even_delay_
//		);
//		previous_bitplanes_ = next_bitplanes_;
//	}

	// Advance audio.
	audio_.output();

	// Trigger any sprite loads encountered.
	constexpr auto dcycle = cycle << 1;
	static_assert(std::tuple_size<decltype(sprites_)>::value % 2 == 0);
	for(size_t c = 0; c < sprites_.size(); c += 2) {
		if( sprites_[c].visible &&
			dcycle <= sprites_[c].h_start &&
			dcycle+2 > sprites_[c].h_start) {
			sprite_shifters_[c >> 1].load<0>(
				sprites_[c].data[1],
				sprites_[c].data[0],
				sprites_[c].h_start & 1);
		}

		if(	sprites_[c+1].visible &&
			dcycle <= sprites_[c + 1].h_start &&
			dcycle+2 > sprites_[c + 1].h_start) {
			sprite_shifters_[c >> 1].load<1>(
				sprites_[c + 1].data[1],
				sprites_[c + 1].data[0],
				sprites_[c + 1].h_start & 1);
		}
	}

	//
	// Horizontal sync: HC18–HC35;
	// Horizontal blank: HC15–HC53.
	//
	// Beyond that: guesswork.
	//
	// So, from cycle 0:
	//
	//	15 cycles border/pixels;
	//	3 cycles blank;
	//	17 cycles sync;
	//	3 cycles blank;
	//	9 cycles colour burst;
	//	6 cycles blank;
	//	then more border/pixels to end of line.
	//
	// (???)

	constexpr int end_of_pixels	= 15;
	constexpr int blank1		= 3 + end_of_pixels;
	constexpr int sync			= 17 + blank1;
	constexpr int blank2		= 3 + sync;
	constexpr int burst			= 9 + blank2;
	constexpr int blank3		= 6 + burst;
	static_assert(blank3 == 53);

#define LINK(location, action, length)	\
	if(cycle == (location))	{			\
		crt_.action((length) * 4);		\
	}

	if(y_ < vertical_blank_height_) {
		if(!cycle) {
			flush_output();
		}

		// Put three lines of sync at the centre of the vertical blank period.
		// Offset by half a line if interlaced and on an odd frame.
		const int midline = vertical_blank_height_ >> 1;
		if(is_long_field_) {
			if(y_ < midline - 1 || y_ > midline + 2) {
				LINK(blank1, output_blank, blank1);
				LINK(sync, output_sync, sync - blank1);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - sync);
			} else if(y_ == midline - 1) {
				LINK(113, output_blank, 113);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - 113);
			} else if(y_ == midline + 2) {
				LINK(113, output_sync, 113);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - 113);
			} else {
				LINK(blank1, output_sync, blank1);
				LINK(sync, output_blank, sync - blank1);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - sync);
			}
		} else {
			if(y_ < midline - 1 || y_ > midline + 1) {
				LINK(blank1, output_blank, blank1);
				LINK(sync, output_sync, sync - blank1);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - sync);
			} else {
				LINK(blank1, output_sync, blank1);
				LINK(sync, output_blank, sync - blank1);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - sync);
			}
		}
	} else {
		// TODO: incorporate the lowest display window bits elsewhere.
		display_horizontal_ |= cycle == (display_window_start_[0] >> 1);
		display_horizontal_ &= cycle != (display_window_stop_[0] >> 1);

		if(cycle == end_of_pixels) {
			flush_output();
		}

		// Output the correct sequence of blanks, syncs and burst atomically.
		LINK(blank1, output_blank, blank1 - end_of_pixels);
		LINK(sync, output_sync, sync - blank1);
		LINK(blank2, output_blank, blank2 - sync);
		LINK(burst, output_default_colour_burst, burst - blank2);	// TODO: only if colour enabled.
		LINK(blank3, output_blank, blank3 - burst);

		if constexpr (cycle < end_of_pixels || cycle > blank3) {
			const bool is_pixel_display = display_horizontal_ && fetch_vertical_;

			if(
				(is_pixel_display == is_border_) ||
				(is_border_ && border_colour_ != palette_[0])) {
				flush_output();

				is_border_ = !is_pixel_display;
				border_colour_ = palette_[0];
			}

			if(is_pixel_display) {
				// This is factored out because it is fairly convoluted and is not a function of
				// the template parameter; I doubt I'm somehow being smarter than the optimising
				// compiler, but this makes my debugging life a lot easier and I don't imagine
				// the compiler will do a worse job.
				output_pixels(line_length_ + end_of_pixels - cycle);
			}
			++zone_duration_;
		}
	}
#undef LINK

	// Update all active pixel shifters.
	bitplane_pixels_.shift(is_high_res_);
	sprite_shifters_[0].shift();
	sprite_shifters_[1].shift();
	sprite_shifters_[2].shift();
	sprite_shifters_[3].shift();
}